

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

bool __thiscall
ON_RenderContentPrivate::ChangeChild
          (ON_RenderContentPrivate *this,ON_RenderContent *old_child,ON_RenderContent *new_child)

{
  ON_RenderContent *pOVar1;
  ON_RenderContent *prev_sibling;
  ON_RenderContent *new_child_local;
  ON_RenderContent *old_child_local;
  ON_RenderContentPrivate *this_local;
  
  if (old_child == (ON_RenderContent *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (old_child == this->m_first_child) {
      if (new_child == (ON_RenderContent *)0x0) {
        this->m_first_child = old_child->_private->m_next_sibling;
      }
      else {
        this->m_first_child = new_child;
      }
    }
    else {
      pOVar1 = FindPrevSibling(this,old_child);
      if (pOVar1 == (ON_RenderContent *)0x0) {
        return false;
      }
      if (new_child == (ON_RenderContent *)0x0) {
        pOVar1->_private->m_next_sibling = old_child->_private->m_next_sibling;
      }
      else {
        pOVar1->_private->m_next_sibling = new_child;
      }
    }
    if (new_child != (ON_RenderContent *)0x0) {
      new_child->_private->m_next_sibling = old_child->_private->m_next_sibling;
      new_child->_private->m_parent = old_child->_private->m_parent;
    }
    if (old_child != (ON_RenderContent *)0x0) {
      (*(old_child->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RenderContentPrivate::ChangeChild(ON_RenderContent* old_child, ON_RenderContent* new_child)
{
  if (nullptr == old_child)
    return false;

  if (old_child == m_first_child)
  {
    if (nullptr != new_child)
    {
      m_first_child = new_child;
    }
    else
    {
      m_first_child = old_child->_private->m_next_sibling;
    }
  }
  else
  {
    const ON_RenderContent* prev_sibling = FindPrevSibling(old_child);
    if (nullptr == prev_sibling)
      return false;

    if (nullptr != new_child)
    {
      prev_sibling->_private->m_next_sibling = new_child;
    }
    else
    {
      prev_sibling->_private->m_next_sibling = old_child->_private->m_next_sibling;
    }
  }

  if (nullptr != new_child)
  {
    new_child->_private->m_next_sibling = old_child->_private->m_next_sibling;
    new_child->_private->m_parent = old_child->_private->m_parent;
  }

  delete old_child;

  return true;
}